

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

int deqp::gles2::Functional::getNumSamplersInType(VarType *type)

{
  pointer pSVar1;
  int iVar2;
  VarType *type_00;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = 1;
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
    iVar3 = iVar3 * (type->m_data).array.size;
  }
  if (type->m_type == TYPE_BASIC) {
    uVar4 = (uint)((type->m_data).basic.type - TYPE_SAMPLER_1D < 0x1e);
  }
  else {
    pSVar1 = (((type->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (int)((long)(((type->m_data).structPtr)->m_members).
                        super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x49249249
    ;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    else {
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      type_00 = &pSVar1->m_type;
      uVar4 = 0;
      do {
        iVar2 = getNumSamplersInType(type_00);
        uVar4 = uVar4 + iVar2;
        type_00 = (VarType *)&type_00[2].m_data;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  return uVar4 * iVar3;
}

Assistant:

static int getNumSamplersInType (const glu::VarType& type)
{
	if (type.isBasicType())
		return glu::isDataTypeSampler(type.getBasicType()) ? 1 : 0;
	else if (type.isArrayType())
		return getNumSamplersInType(type.getElementType()) * type.getArraySize();
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		int sum = 0;
		for (int i = 0; i < structType.getNumMembers(); i++)
			sum += getNumSamplersInType(structType.getMember(i).getType());
		return sum;
	}
}